

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::InstanceIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  InstancePrimitive *prim;
  undefined4 uVar15;
  ulong unaff_R14;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1031;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  ulong local_1008;
  ulong local_1000;
  undefined1 (*local_ff8) [16];
  ulong local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_ff8 = (undefined1 (*) [16])local_f68;
      local_fb8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_f88 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar23 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar24 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar48 = (ray->super_RayK<1>).dir.field_0.m128[2];
      fVar49 = (ray->super_RayK<1>).dir.field_0.m128[3];
      fVar22 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_f98 = 0.0;
      if (0.0 <= fVar22) {
        local_f98 = fVar22;
      }
      fVar22 = (ray->super_RayK<1>).tfar;
      fVar21 = 0.0;
      if (0.0 <= fVar22) {
        fVar21 = fVar22;
      }
      uVar17 = -(uint)(1e-18 <= ABS(fVar23));
      uVar18 = -(uint)(1e-18 <= ABS(fVar24));
      uVar19 = -(uint)(1e-18 <= ABS(fVar48));
      uVar20 = -(uint)(1e-18 <= ABS(fVar49));
      auVar29._0_4_ = (uint)fVar23 & uVar17;
      auVar29._4_4_ = (uint)fVar24 & uVar18;
      auVar29._8_4_ = (uint)fVar48 & uVar19;
      auVar29._12_4_ = (uint)fVar49 & uVar20;
      auVar35._0_8_ = CONCAT44(~uVar18,~uVar17) & 0x219392ef219392ef;
      auVar35._8_4_ = ~uVar19 & 0x219392ef;
      auVar35._12_4_ = ~uVar20 & 0x219392ef;
      auVar35 = auVar35 | auVar29;
      auVar29 = rcpps(auVar29,auVar35);
      local_fd8 = auVar29._0_4_;
      local_fe8 = auVar29._4_4_;
      local_fa8 = auVar29._8_4_;
      local_fd8 = (1.0 - auVar35._0_4_ * local_fd8) * local_fd8 + local_fd8;
      local_fe8 = (1.0 - auVar35._4_4_ * local_fe8) * local_fe8 + local_fe8;
      local_fa8 = (1.0 - auVar35._8_4_ * local_fa8) * local_fa8 + local_fa8;
      local_1000 = (ulong)(local_fd8 < 0.0) << 4;
      local_1008 = (ulong)(local_fe8 < 0.0) << 4 | 0x20;
      local_1020 = (ulong)(local_fa8 < 0.0) << 4 | 0x40;
      local_1028 = local_1000 ^ 0x10;
      local_1030 = local_1008 ^ 0x10;
      local_ff0 = local_1020 ^ 0x10;
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      uVar8 = local_1008;
      uVar9 = local_1020;
      uVar10 = local_1028;
      uVar12 = local_1030;
      uVar16 = local_1000;
      fVar22 = fVar21;
      fVar23 = fVar21;
      fVar24 = fVar21;
      fVar48 = local_f88;
      fVar49 = local_f88;
      fVar50 = local_f88;
      fVar51 = local_f88;
      fVar52 = local_f98;
      fVar53 = local_f98;
      fVar54 = local_f98;
      fVar55 = local_f98;
      fVar56 = local_fa8;
      fVar57 = local_fa8;
      fVar58 = local_fa8;
      fVar59 = local_fa8;
      fVar60 = local_fb8;
      fVar61 = local_fb8;
      fVar62 = local_fb8;
      fVar63 = local_fb8;
      fVar64 = local_fc8;
      fVar65 = local_fc8;
      fVar66 = local_fc8;
      fVar67 = local_fc8;
      fVar68 = local_fd8;
      fVar69 = local_fd8;
      fVar70 = local_fd8;
      fVar71 = local_fd8;
      fVar72 = local_fe8;
      fVar73 = local_fe8;
      fVar74 = local_fe8;
      fVar75 = local_fe8;
      do {
        do {
          if (local_ff8 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar5 = local_ff8 + -1;
          local_ff8 = local_ff8 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar5 + 8));
        uVar14 = *(ulong *)*local_ff8;
        do {
          if ((uVar14 & 8) == 0) {
            pfVar1 = (float *)(uVar14 + 0x20 + uVar16);
            auVar47._0_4_ = (*pfVar1 - fVar60) * fVar68;
            auVar47._4_4_ = (pfVar1[1] - fVar61) * fVar69;
            auVar47._8_4_ = (pfVar1[2] - fVar62) * fVar70;
            auVar47._12_4_ = (pfVar1[3] - fVar63) * fVar71;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar8);
            auVar30._0_4_ = (*pfVar1 - fVar64) * fVar72;
            auVar30._4_4_ = (pfVar1[1] - fVar65) * fVar73;
            auVar30._8_4_ = (pfVar1[2] - fVar66) * fVar74;
            auVar30._12_4_ = (pfVar1[3] - fVar67) * fVar75;
            auVar29 = maxps(auVar47,auVar30);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar9);
            auVar31._0_4_ = (*pfVar1 - fVar48) * fVar56;
            auVar31._4_4_ = (pfVar1[1] - fVar49) * fVar57;
            auVar31._8_4_ = (pfVar1[2] - fVar50) * fVar58;
            auVar31._12_4_ = (pfVar1[3] - fVar51) * fVar59;
            auVar45._4_4_ = fVar53;
            auVar45._0_4_ = fVar52;
            auVar45._8_4_ = fVar54;
            auVar45._12_4_ = fVar55;
            auVar35 = maxps(auVar31,auVar45);
            local_1018 = maxps(auVar29,auVar35);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar10);
            auVar32._0_4_ = (*pfVar1 - fVar60) * fVar68;
            auVar32._4_4_ = (pfVar1[1] - fVar61) * fVar69;
            auVar32._8_4_ = (pfVar1[2] - fVar62) * fVar70;
            auVar32._12_4_ = (pfVar1[3] - fVar63) * fVar71;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar12);
            auVar36._0_4_ = (*pfVar1 - fVar64) * fVar72;
            auVar36._4_4_ = (pfVar1[1] - fVar65) * fVar73;
            auVar36._8_4_ = (pfVar1[2] - fVar66) * fVar74;
            auVar36._12_4_ = (pfVar1[3] - fVar67) * fVar75;
            auVar29 = minps(auVar32,auVar36);
            pfVar1 = (float *)(uVar14 + 0x20 + local_ff0);
            auVar37._0_4_ = (*pfVar1 - fVar48) * fVar56;
            auVar37._4_4_ = (pfVar1[1] - fVar49) * fVar57;
            auVar37._8_4_ = (pfVar1[2] - fVar50) * fVar58;
            auVar37._12_4_ = (pfVar1[3] - fVar51) * fVar59;
            auVar43._4_4_ = fVar22;
            auVar43._0_4_ = fVar21;
            auVar43._8_4_ = fVar23;
            auVar43._12_4_ = fVar24;
            auVar35 = minps(auVar37,auVar43);
            auVar29 = minps(auVar29,auVar35);
            auVar25._4_4_ = -(uint)(local_1018._4_4_ <= auVar29._4_4_);
            auVar25._0_4_ = -(uint)(local_1018._0_4_ <= auVar29._0_4_);
            auVar25._8_4_ = -(uint)(local_1018._8_4_ <= auVar29._8_4_);
            auVar25._12_4_ = -(uint)(local_1018._12_4_ <= auVar29._12_4_);
            uVar15 = movmskps((int)unaff_R14,auVar25);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar15);
          }
          if ((uVar14 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar6 = 4;
            }
            else {
              uVar13 = uVar14 & 0xfffffffffffffff0;
              lVar7 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              iVar6 = 0;
              uVar14 = *(ulong *)(uVar13 + lVar7 * 8);
              uVar11 = unaff_R14 - 1 & unaff_R14;
              if (uVar11 != 0) {
                uVar17 = *(uint *)(local_1018 + lVar7 * 4);
                lVar7 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar13 + lVar7 * 8);
                uVar18 = *(uint *)(local_1018 + lVar7 * 4);
                uVar11 = uVar11 - 1 & uVar11;
                uVar9 = local_1020;
                uVar10 = local_1028;
                uVar12 = local_1030;
                if (uVar11 == 0) {
                  if (uVar17 < uVar18) {
                    *(ulong *)*local_ff8 = uVar4;
                    *(uint *)((long)*local_ff8 + 8) = uVar18;
                    local_ff8 = local_ff8 + 1;
                  }
                  else {
                    *(ulong *)*local_ff8 = uVar14;
                    *(uint *)((long)*local_ff8 + 8) = uVar17;
                    local_ff8 = local_ff8 + 1;
                    uVar14 = uVar4;
                  }
                }
                else {
                  auVar26._8_4_ = uVar17;
                  auVar26._0_8_ = uVar14;
                  auVar26._12_4_ = 0;
                  auVar33._8_4_ = uVar18;
                  auVar33._0_8_ = uVar4;
                  auVar33._12_4_ = 0;
                  lVar7 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                    }
                  }
                  uVar14 = *(ulong *)(uVar13 + lVar7 * 8);
                  iVar2 = *(int *)(local_1018 + lVar7 * 4);
                  auVar38._8_4_ = iVar2;
                  auVar38._0_8_ = uVar14;
                  auVar38._12_4_ = 0;
                  auVar40._8_4_ = -(uint)((int)uVar17 < (int)uVar18);
                  uVar11 = uVar11 - 1 & uVar11;
                  if (uVar11 == 0) {
                    auVar40._4_4_ = auVar40._8_4_;
                    auVar40._0_4_ = auVar40._8_4_;
                    auVar40._12_4_ = auVar40._8_4_;
                    auVar29 = auVar26 & auVar40 | ~auVar40 & auVar33;
                    auVar35 = auVar33 & auVar40 | ~auVar40 & auVar26;
                    auVar41._8_4_ = -(uint)(auVar29._8_4_ < iVar2);
                    auVar41._0_8_ = CONCAT44(auVar41._8_4_,auVar41._8_4_);
                    auVar41._12_4_ = auVar41._8_4_;
                    uVar14 = ~auVar41._0_8_ & uVar14 | auVar29._0_8_ & auVar41._0_8_;
                    auVar29 = auVar38 & auVar41 | ~auVar41 & auVar29;
                    auVar27._8_4_ = -(uint)(auVar35._8_4_ < auVar29._8_4_);
                    auVar27._4_4_ = auVar27._8_4_;
                    auVar27._0_4_ = auVar27._8_4_;
                    auVar27._12_4_ = auVar27._8_4_;
                    *local_ff8 = ~auVar27 & auVar35 | auVar29 & auVar27;
                    local_ff8[1] = auVar35 & auVar27 | ~auVar27 & auVar29;
                    local_ff8 = local_ff8 + 2;
                  }
                  else {
                    lVar7 = 0;
                    if (uVar11 != 0) {
                      for (; (uVar11 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                      }
                    }
                    iVar3 = *(int *)(local_1018 + lVar7 * 4);
                    auVar44._8_4_ = iVar3;
                    auVar44._0_8_ = *(undefined8 *)(uVar13 + lVar7 * 8);
                    auVar44._12_4_ = 0;
                    auVar42._4_4_ = auVar40._8_4_;
                    auVar42._0_4_ = auVar40._8_4_;
                    auVar42._8_4_ = auVar40._8_4_;
                    auVar42._12_4_ = auVar40._8_4_;
                    auVar29 = auVar26 & auVar42 | ~auVar42 & auVar33;
                    auVar35 = auVar33 & auVar42 | ~auVar42 & auVar26;
                    auVar46._0_4_ = -(uint)(iVar2 < iVar3);
                    auVar46._4_4_ = -(uint)(iVar2 < iVar3);
                    auVar46._8_4_ = -(uint)(iVar2 < iVar3);
                    auVar46._12_4_ = -(uint)(iVar2 < iVar3);
                    auVar43 = auVar38 & auVar46 | ~auVar46 & auVar44;
                    auVar47 = ~auVar46 & auVar38 | auVar44 & auVar46;
                    auVar39._8_4_ = -(uint)(auVar35._8_4_ < auVar47._8_4_);
                    auVar39._4_4_ = auVar39._8_4_;
                    auVar39._0_4_ = auVar39._8_4_;
                    auVar39._12_4_ = auVar39._8_4_;
                    auVar45 = auVar35 & auVar39 | ~auVar39 & auVar47;
                    auVar34._8_4_ = -(uint)(auVar29._8_4_ < auVar43._8_4_);
                    auVar34._0_8_ = CONCAT44(auVar34._8_4_,auVar34._8_4_);
                    auVar34._12_4_ = auVar34._8_4_;
                    uVar14 = auVar29._0_8_ & auVar34._0_8_ | ~auVar34._0_8_ & auVar43._0_8_;
                    auVar29 = ~auVar34 & auVar29 | auVar43 & auVar34;
                    auVar28._8_4_ = -(uint)(auVar29._8_4_ < auVar45._8_4_);
                    auVar28._4_4_ = auVar28._8_4_;
                    auVar28._0_4_ = auVar28._8_4_;
                    auVar28._12_4_ = auVar28._8_4_;
                    *local_ff8 = ~auVar39 & auVar35 | auVar47 & auVar39;
                    local_ff8[1] = ~auVar28 & auVar29 | auVar45 & auVar28;
                    local_ff8[2] = auVar29 & auVar28 | ~auVar28 & auVar45;
                    local_ff8 = local_ff8 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar6 = 6;
          }
        } while (iVar6 == 0);
        if (iVar6 == 6) {
          lVar7 = (ulong)((uint)uVar14 & 0xf) - 8;
          if (lVar7 != 0) {
            prim = (InstancePrimitive *)(uVar14 & 0xfffffffffffffff0);
            do {
              InstanceIntersector1::intersect(&local_1031,ray,context,prim);
              prim = prim + 1;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          fVar21 = (ray->super_RayK<1>).tfar;
          uVar8 = local_1008;
          uVar9 = local_1020;
          uVar10 = local_1028;
          uVar12 = local_1030;
          uVar16 = local_1000;
          fVar22 = fVar21;
          fVar23 = fVar21;
          fVar24 = fVar21;
          fVar48 = local_f88;
          fVar49 = fStack_f84;
          fVar50 = fStack_f80;
          fVar51 = fStack_f7c;
          fVar52 = local_f98;
          fVar53 = fStack_f94;
          fVar54 = fStack_f90;
          fVar55 = fStack_f8c;
          fVar56 = local_fa8;
          fVar57 = fStack_fa4;
          fVar58 = fStack_fa0;
          fVar59 = fStack_f9c;
          fVar60 = local_fb8;
          fVar61 = fStack_fb4;
          fVar62 = fStack_fb0;
          fVar63 = fStack_fac;
          fVar64 = local_fc8;
          fVar65 = fStack_fc4;
          fVar66 = fStack_fc0;
          fVar67 = fStack_fbc;
          fVar68 = local_fd8;
          fVar69 = fStack_fd4;
          fVar70 = fStack_fd0;
          fVar71 = fStack_fcc;
          fVar72 = local_fe8;
          fVar73 = fStack_fe4;
          fVar74 = fStack_fe0;
          fVar75 = fStack_fdc;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }